

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O0

ssize_t __thiscall
jpgd::jpeg_decoder_file_stream::read
          (jpeg_decoder_file_stream *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  size_t sVar2;
  undefined4 in_register_00000034;
  int bytes_read;
  uint local_4;
  
  if (this->m_pFile == (FILE *)0x0) {
    local_4 = 0xffffffff;
  }
  else if ((this->m_eof_flag & 1U) == 0) {
    if ((this->m_error_flag & 1U) == 0) {
      sVar2 = fread((void *)CONCAT44(in_register_00000034,__fd),1,(long)(int)__buf,
                    (FILE *)this->m_pFile);
      local_4 = (uint)sVar2;
      if ((int)local_4 < (int)__buf) {
        iVar1 = ferror((FILE *)this->m_pFile);
        if (iVar1 == 0) {
          this->m_eof_flag = true;
          *(undefined1 *)__nbytes = 1;
        }
        else {
          this->m_error_flag = true;
          local_4 = 0xffffffff;
        }
      }
    }
    else {
      local_4 = 0xffffffff;
    }
  }
  else {
    *(undefined1 *)__nbytes = 1;
    local_4 = 0;
  }
  return (ulong)local_4;
}

Assistant:

int jpeg_decoder_file_stream::read(uint8* pBuf, int max_bytes_to_read, bool* pEOF_flag) {
  if (!m_pFile)
    return -1;

  if (m_eof_flag) {
    *pEOF_flag = true;
    return 0;
  }

  if (m_error_flag)
    return -1;

  int bytes_read = static_cast<int>(fread(pBuf, 1, max_bytes_to_read, m_pFile));
  if (bytes_read < max_bytes_to_read) {
    if (ferror(m_pFile)) {
      m_error_flag = true;
      return -1;
    }

    m_eof_flag = true;
    *pEOF_flag = true;
  }

  return bytes_read;
}